

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

char * get_full_name(c2m_ctx_t c2m_ctx,char *base,char *name,int dir_base_p)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  FILE *__stream;
  size_t sVar6;
  VARR_char *pVVar7;
  char *__filename;
  
  pVVar7 = c2m_ctx->temp_string;
  if ((pVVar7 == (VARR_char *)0x0) || (pcVar5 = pVVar7->varr, pcVar5 == (char *)0x0)) {
LAB_0019419d:
    get_full_name_cold_4();
  }
  else {
    pVVar7->els_num = 0;
    if (*base == '\0') {
      if ((name != (char *)0x0) && (*name != '\0')) {
        return name;
      }
      __assert_fail("name != NULL && name[0] != \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x97c,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
    }
    if (dir_base_p == 0) {
      __filename = base;
      pcVar3 = strrchr(base,0x2f);
      if (pcVar3 == (char *)0x0) {
        add_to_temp_string(c2m_ctx,".");
LAB_001940a5:
        add_to_temp_string(c2m_ctx,"/");
      }
      else {
        if (pcVar3 < base) {
          uVar4 = 1;
          sVar6 = 0;
        }
        else {
          do {
            pVVar7 = c2m_ctx->temp_string;
            pcVar5 = pVVar7->varr;
            if (pcVar5 == (char *)0x0) {
              get_full_name_cold_2();
              goto LAB_0019419d;
            }
            sVar6 = pVVar7->els_num;
            cVar1 = *base;
            uVar4 = sVar6 + 1;
            if (pVVar7->size < uVar4) {
              sVar2 = (uVar4 >> 1) + uVar4;
              __filename = pcVar5;
              pcVar5 = (char *)realloc(pcVar5,sVar2);
              pVVar7->varr = pcVar5;
              pVVar7->size = sVar2;
              sVar6 = pVVar7->els_num;
              uVar4 = sVar6 + 1;
            }
            base = base + 1;
            pVVar7->els_num = uVar4;
            pcVar5[sVar6] = cVar1;
          } while (base <= pcVar3);
          pVVar7 = c2m_ctx->temp_string;
          pcVar5 = pVVar7->varr;
          if (pcVar5 == (char *)0x0) {
            get_full_name_cold_1();
            __stream = fopen(__filename,"r");
            if (__stream != (FILE *)0x0) {
              fclose(__stream);
            }
            return (char *)(ulong)(__stream != (FILE *)0x0);
          }
          sVar6 = pVVar7->els_num;
          uVar4 = sVar6 + 1;
        }
        if (pVVar7->size < uVar4) {
          sVar2 = (uVar4 >> 1) + uVar4;
          pcVar5 = (char *)realloc(pcVar5,sVar2);
          pVVar7->varr = pcVar5;
          pVVar7->size = sVar2;
          sVar6 = pVVar7->els_num;
          uVar4 = sVar6 + 1;
        }
        pVVar7->els_num = uVar4;
        pcVar5[sVar6] = '\0';
      }
    }
    else {
      sVar2 = strlen(base);
      if (sVar2 == 0) goto LAB_001941a7;
      add_to_temp_string(c2m_ctx,base);
      if (base[sVar2 - 1] != '/') goto LAB_001940a5;
    }
    add_to_temp_string(c2m_ctx,name);
    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
      return c2m_ctx->temp_string->varr;
    }
  }
  get_full_name_cold_3();
LAB_001941a7:
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x984,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
}

Assistant:

static const char *get_full_name (c2m_ctx_t c2m_ctx, const char *base, const char *name,
                                  int dir_base_p) {
  const char *str, *last, *last2, *slash = "/", *slash2 = NULL;
  size_t len;

  VARR_TRUNC (char, temp_string, 0);
  if (base == NULL || *base == '\0') {
    assert (name != NULL && name[0] != '\0');
    return name;
  }
#ifdef _WIN32
  slash2 = "\\";
#endif
  if (dir_base_p) {
    len = strlen (base);
    assert (len > 0);
    add_to_temp_string (c2m_ctx, base);
    if (base[len - 1] != slash[0]) add_to_temp_string (c2m_ctx, slash);
  } else {
    last = strrchr (base, slash[0]);
    last2 = slash2 != NULL ? strrchr (base, slash2[0]) : NULL;
    if (last2 != NULL && (last == NULL || last2 > last)) last = last2;
    if (last != NULL) {
      for (str = base; str <= last; str++) VARR_PUSH (char, temp_string, *str);
      VARR_PUSH (char, temp_string, '\0');
    } else {
      add_to_temp_string (c2m_ctx, ".");
      add_to_temp_string (c2m_ctx, slash);
    }
  }
  add_to_temp_string (c2m_ctx, name);
  return VARR_ADDR (char, temp_string);
}